

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O1

void Abc_TtStoreTest(char *pFileName)

{
  Abc_TtStore_t *p;
  
  p = Abc_TtStoreLoad(pFileName,-1);
  if (p != (Abc_TtStore_t *)0x0) {
    Abc_TtStoreWrite("out.txt",p,0);
    Abc_TtStoreFree(p,-1);
    printf("Input file \"%s\" was copied into output file \"%s\".\n",pFileName,"out.txt");
    return;
  }
  return;
}

Assistant:

void Abc_TtStoreTest( char * pFileName )
{ 
    Abc_TtStore_t * p;
    char * pFileInput  = pFileName;
    char * pFileOutput = "out.txt";

    // read info from file
    p = Abc_TtStoreLoad( pFileInput, -1 );
    if ( p == NULL )
        return;

    // write into another file
    Abc_TtStoreWrite( pFileOutput, p, 0 );

    // delete data-structure
    Abc_TtStoreFree( p, -1 );
    printf( "Input file \"%s\" was copied into output file \"%s\".\n", pFileInput, pFileOutput );
}